

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType2::GridDataType2
          (GridDataType2 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  ushort local_32;
  float local_30;
  KUINT16 i;
  KFLOAT32 tmp;
  KDataStream *local_20;
  KDataStream *stream_local;
  KUINT16 DataRepresentation_local;
  GridDataType2 *pGStack_10;
  KUINT16 SampleType_local;
  GridDataType2 *this_local;
  
  local_20 = stream;
  stream_local._4_2_ = DataRepresentation;
  stream_local._6_2_ = SampleType;
  pGStack_10 = this;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType2_00332cc8;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_vf32Values);
  (this->super_GridData).m_ui16SmpTyp = stream_local._6_2_;
  (this->super_GridData).m_ui16DtRep = stream_local._4_2_;
  KDataStream::operator>>(local_20,(unsigned_short *)&(this->super_GridData).field_0xc);
  local_30 = 0.0;
  for (local_32 = 0; local_32 < *(ushort *)&(this->super_GridData).field_0xc;
      local_32 = local_32 + 1) {
    KDataStream::operator>>(local_20,&local_30);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_vf32Values,&local_30);
  }
  KDataStream::operator>>(local_20,&this->m_ui16Padding);
  return;
}

Assistant:

GridDataType2::GridDataType2( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;

    stream >> m_ui16NumValues;

    KFLOAT32 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vf32Values.push_back( tmp );
    }

    stream >> m_ui16Padding;
}